

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

void config_array_destroy(config_array *array)

{
  ulong uVar1;
  
  if (array->length != 0) {
    uVar1 = 0;
    do {
      if (array->values[uVar1] != (config_value *)0x0) {
        config_value_destroy(array->values[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < array->length);
  }
  free(array->values);
  free(array);
  return;
}

Assistant:

void config_array_destroy(struct config_array *array)
{
        for (size_t i = 0; i < array->length; ++i) {
                struct config_value *value_to_destroy = array->values[i];

                if (value_to_destroy != NULL) {
                        config_value_destroy(value_to_destroy);
                }
        }

        free(array->values);
        free(array);
}